

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O1

ssize_t __thiscall
gvr::anon_unknown_3::PLYValueBigUInt32::read
          (PLYValueBigUInt32 *this,int __fd,void *__buf,size_t __nbytes)

{
  byte *pbVar1;
  long *plVar2;
  byte bVar3;
  uint uVar4;
  undefined4 in_register_00000034;
  
  plVar2 = (long *)CONCAT44(in_register_00000034,__fd);
  pbVar1 = *(byte **)(CONCAT44(in_register_00000034,__fd) + 0x10);
  if (pbVar1 < *(byte **)(CONCAT44(in_register_00000034,__fd) + 0x18)) {
    uVar4 = (uint)*pbVar1;
    plVar2[2] = (long)(pbVar1 + 1);
  }
  else {
    uVar4 = (**(code **)(*plVar2 + 0x50))(plVar2);
  }
  this->value = uVar4 << 0x18;
  pbVar1 = (byte *)plVar2[2];
  if (pbVar1 < (byte *)plVar2[3]) {
    bVar3 = *pbVar1;
    plVar2[2] = (long)(pbVar1 + 1);
  }
  else {
    bVar3 = (**(code **)(*plVar2 + 0x50))(plVar2);
  }
  this->value = this->value | (uint)bVar3 << 0x10;
  pbVar1 = (byte *)plVar2[2];
  if (pbVar1 < (byte *)plVar2[3]) {
    uVar4 = (uint)*pbVar1;
    plVar2[2] = (long)(pbVar1 + 1);
  }
  else {
    uVar4 = (**(code **)(*plVar2 + 0x50))(plVar2);
  }
  this->value = this->value | (uVar4 & 0xff) << 8;
  pbVar1 = (byte *)plVar2[2];
  if (pbVar1 < (byte *)plVar2[3]) {
    bVar3 = *pbVar1;
    plVar2[2] = (long)(pbVar1 + 1);
  }
  else {
    bVar3 = (**(code **)(*plVar2 + 0x50))(plVar2);
  }
  this->value = this->value | (uint)bVar3;
  return (ulong)bVar3;
}

Assistant:

void read(std::streambuf *in)
    {
      value=(in->sbumpc()&0xff)<<24;
      value|=(in->sbumpc()&0xff)<<16;
      value|=(in->sbumpc()&0xff)<<8;
      value|=in->sbumpc()&0xff;
    }